

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_literal
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel,bool explicit_key,bool explicit_indentation)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  size_t sVar5;
  char *pcVar6;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined3 in_register_00000081;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ro_substr chars;
  basic_substring<const_char> bVar15;
  basic_substring<const_char> local_68;
  char *local_58;
  basic_substring<const_char> local_50;
  ulong local_40;
  long local_38;
  
  local_50.len = s.len;
  local_50.str = s.str;
  if (CONCAT31(in_register_00000081,explicit_key) != 0) {
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),0x1ffd55);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 2;
  }
  chars.len = 2;
  chars.str = "\n\r";
  bVar15 = basic_substring<const_char>::trimr(&local_50,chars);
  uVar14 = bVar15.len;
  local_58 = bVar15.str;
  lVar11 = local_50.len - uVar14;
  if (local_50.len < uVar14) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x1ff947,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            (&local_68,local_50.str + uVar14,local_50.len - uVar14);
  lVar9 = 0;
  sVar5 = basic_substring<const_char>::first_of(&local_68,'\r',0);
  if (sVar5 != 0xffffffffffffffff) {
    lVar9 = 0;
    do {
      sVar5 = basic_substring<const_char>::first_of(&local_68,'\r',sVar5 + 1);
      lVar9 = lVar9 + -1;
    } while (sVar5 != 0xffffffffffffffff);
  }
  uVar12 = lVar11 + lVar9;
  pbVar7 = (this->
           super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_stream + 0x10;
  if (explicit_indentation) {
    lVar11 = 2;
    std::ostream::write((char *)pbVar7,0x1ffd58);
  }
  else {
    std::ostream::put((char)pbVar7);
    lVar11 = 1;
  }
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + lVar11;
  if ((uVar12 < 2) && ((uVar14 != 0 || (local_50.len == 0)))) {
    pbVar7 = (this->
             super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).m_stream + 0x10;
    if (uVar12 == 1) {
      std::ostream::put((char)pbVar7);
      lVar11 = 1;
      goto LAB_00191122;
    }
    pcVar6 = "-\n";
  }
  else {
    pbVar7 = (this->
             super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).m_stream + 0x10;
    pcVar6 = "+\n";
  }
  lVar11 = 2;
  std::ostream::write((char *)pbVar7,(long)pcVar6);
LAB_00191122:
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + lVar11;
  if (uVar14 != 0) {
    local_38 = ilevel + 1;
    uVar13 = 0;
    uVar8 = 0;
    local_40 = uVar12;
    do {
      uVar12 = uVar8;
      if (local_58[uVar13] == '\n') {
        if (uVar14 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1ff947,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar12 = uVar13 + 1;
        uVar10 = uVar12;
        if (uVar12 == 0xffffffffffffffff) {
          uVar10 = uVar14;
        }
        if (uVar10 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1ff947,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar14 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1ff947,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_68,local_58 + uVar8,uVar10 - uVar8);
        sVar5 = local_68.len;
        pcVar6 = local_68.str;
        lVar11 = local_38;
        if (ilevel != 0xffffffffffffffff) {
          do {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        if (pcVar6 != (char *)0x0 && sVar5 != 0) {
          std::ostream::write((char *)((this->
                                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).m_stream + 0x10),(long)pcVar6);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar5;
        }
      }
      uVar13 = uVar13 + 1;
      uVar8 = uVar12;
    } while (uVar13 != uVar14);
    if (uVar12 < uVar14) {
      if (ilevel != 0xffffffffffffffff) {
        lVar11 = ilevel + 1;
        do {
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      if (uVar14 < uVar12) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        handle_error(0x1ff947,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring(&local_68,local_58 + uVar12,uVar14 - uVar12);
      if (local_68.str != (char *)0x0 && local_68.len != 0) {
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)local_68.str);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + local_68.len;
      }
    }
    uVar12 = local_40;
    if (local_40 == 0) {
      uVar12 = 0;
    }
    else {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
      uVar12 = uVar12 - 1;
    }
  }
  if (uVar12 != 0) {
    uVar14 = 0;
    do {
      lVar11 = ilevel + 1;
      if (ilevel != 0xffffffffffffffff) {
        do {
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      uVar14 = uVar14 + 1;
      if (uVar14 < uVar12 || explicit_key) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
    } while (uVar14 != uVar12);
  }
  if (explicit_key && uVar12 == 0) {
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_literal(csubstr s, size_t ilevel, bool explicit_key, bool explicit_indentation)
{
    if(explicit_key)
        this->Writer::_do_write("? ");
    csubstr trimmed = s.trimr("\n\r");
    size_t numnewlines_at_end = s.len - trimmed.len - s.sub(trimmed.len).count('\r');
    //
    if(!explicit_indentation)
        this->Writer::_do_write('|');
    else
        this->Writer::_do_write("|2");
    //
    if(numnewlines_at_end > 1 || (trimmed.len == 0 && s.len > 0)/*only newlines*/)
        this->Writer::_do_write("+\n");
    else if(numnewlines_at_end == 1)
        this->Writer::_do_write('\n');
    else
        this->Writer::_do_write("-\n");
    //
    if(trimmed.len)
    {
        size_t pos = 0; // tracks the last character that was already written
        for(size_t i = 0; i < trimmed.len; ++i)
        {
            if(trimmed[i] != '\n')
                continue;
            // write everything up to this point
            csubstr since_pos = trimmed.range(pos, i+1); // include the newline
            _rymlindent_nextline()
            this->Writer::_do_write(since_pos);
            pos = i+1; // already written
        }
        if(pos < trimmed.len)
        {
            _rymlindent_nextline()
            this->Writer::_do_write(trimmed.sub(pos));
        }
        if(numnewlines_at_end)
        {
            this->Writer::_do_write('\n');
            --numnewlines_at_end;
        }
    }
    for(size_t i = 0; i < numnewlines_at_end; ++i)
    {
        _rymlindent_nextline()
        if(i+1 < numnewlines_at_end || explicit_key)
            this->Writer::_do_write('\n');
    }
    if(explicit_key && !numnewlines_at_end)
        this->Writer::_do_write('\n');
}